

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_ObjFaninNumberNew(Vec_Ptr_t *vFanins,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int i;
  
  i = 0;
  while ((iVar2 = -1, i < vFanins->nSize &&
         (pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,i), iVar2 = i, pAVar1 != pFanin))) {
    i = i + 1;
  }
  return iVar2;
}

Assistant:

int Abc_ObjFaninNumberNew( Vec_Ptr_t * vFanins, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}